

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::PrintAllocStats(Recycler *this)

{
  uint uVar1;
  uint uVar2;
  TrackerItem *pTVar3;
  type_info *ptVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  TrackerItem **ppTVar8;
  type_info **pptVar9;
  int index;
  TypeInfotoTrackerItemMap *this_00;
  long lVar10;
  ulong uVar11;
  long local_50;
  long local_48;
  long local_40;
  uint local_34;
  
  if (this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) {
    return;
  }
  uVar11 = 0;
  Output::Print(
               L"=================================================================================================================\n"
               );
  Output::Print(L"Recycler Allocations\n");
  Output::Print(
               L"=================================================================================================================\n"
               );
  Output::Print(
               L"ItemSize  ItemCount   AllocCount  RequestSize      AllocSize        FreeCount   FreeSize         DiffCount   DiffSize        \n"
               );
  Output::Print(
               L"--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"
               );
  this_00 = this->trackerDictionary;
  if (this_00->count - this_00->freeCount < 1) {
    local_48 = 0;
    local_50 = 0;
    lVar10 = 0;
    local_34 = 0;
    local_40 = 0;
  }
  else {
    local_40 = 0;
    local_34 = 0;
    index = 0;
    lVar10 = 0;
    uVar11 = 0;
    local_50 = 0;
    local_48 = 0;
    do {
      ppTVar8 = JsUtil::
                BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetValueAt(this_00,index);
      pTVar3 = *ppTVar8;
      pptVar9 = JsUtil::
                BaseDictionary<const_std::type_info_*,_Memory::Recycler::TrackerItem_*,_Memory::NoCheckHeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt(this->trackerDictionary,index);
      ptVar4 = *pptVar9;
      uVar1 = (pTVar3->instanceData).AllocCount;
      if (uVar1 != 0) {
        lVar5 = (pTVar3->instanceData).AllocSize;
        uVar2 = (pTVar3->instanceData).FreeCount;
        lVar6 = (pTVar3->instanceData).FreeSize;
        pcVar7 = *(char **)(ptVar4 + 8);
        Output::Print(L"%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S\n",
                      (pTVar3->instanceData).ItemSize,(pTVar3->instanceData).ItemCount,(ulong)uVar1,
                      (pTVar3->instanceData).ReqSize,lVar5,(ulong)uVar2,lVar6,(ulong)(uVar1 - uVar2)
                      ,lVar5 - lVar6,pcVar7 + (*pcVar7 == '*'));
        local_40 = local_40 + (pTVar3->instanceData).ItemCount;
        local_34 = local_34 + (pTVar3->instanceData).AllocCount;
        local_48 = local_48 + (pTVar3->instanceData).ReqSize;
        local_50 = local_50 + (pTVar3->instanceData).AllocSize;
        uVar11 = (ulong)(uint)((int)uVar11 + (pTVar3->instanceData).FreeCount);
        lVar10 = lVar10 + (pTVar3->instanceData).FreeSize;
      }
      uVar1 = (pTVar3->arrayData).AllocCount;
      if (uVar1 != 0) {
        lVar5 = (pTVar3->arrayData).AllocSize;
        lVar6 = (pTVar3->arrayData).FreeSize;
        pcVar7 = *(char **)(ptVar4 + 8);
        Output::Print(L"%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S[]\n",
                      (pTVar3->arrayData).ItemSize,(pTVar3->arrayData).ItemCount,(ulong)uVar1,
                      (pTVar3->arrayData).ReqSize,lVar5,(ulong)(uint)(pTVar3->arrayData).FreeCount,
                      lVar6,(ulong)(uint)((pTVar3->instanceData).AllocCount -
                                         (pTVar3->instanceData).FreeCount),lVar5 - lVar6,
                      pcVar7 + (*pcVar7 == '*'));
        local_40 = local_40 + (pTVar3->arrayData).ItemCount;
        local_34 = local_34 + (pTVar3->arrayData).AllocCount;
        local_48 = local_48 + (pTVar3->arrayData).ReqSize;
        local_50 = local_50 + (pTVar3->arrayData).AllocSize;
        uVar11 = (ulong)(uint)((int)uVar11 + (pTVar3->arrayData).FreeCount);
        lVar10 = lVar10 + (pTVar3->arrayData).FreeSize;
      }
      index = index + 1;
      this_00 = this->trackerDictionary;
    } while (index < this_00->count - this_00->freeCount);
  }
  Output::Print(
               L"--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"
               );
  Output::Print(L"            %8d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  **Total**\n"
                ,local_40,(ulong)local_34,local_48,local_50,uVar11,lVar10,
                (ulong)(local_34 - (int)uVar11),local_50 - lVar10);
  Output::Flush();
  return;
}

Assistant:

void
Recycler::PrintAllocStats()
{
    if (this->trackerDictionary == nullptr)
    {
        return;
    }
    size_t itemCount = 0;
    int allocCount = 0;
    int64 reqSize = 0;
    int64 allocSize = 0;
    int freeCount = 0;
    int64 freeSize = 0;
    Output::Print(_u("=================================================================================================================\n"));
    Output::Print(_u("Recycler Allocations\n"));
    Output::Print(_u("=================================================================================================================\n"));
    Output::Print(_u("ItemSize  ItemCount   AllocCount  RequestSize      AllocSize        FreeCount   FreeSize         DiffCount   DiffSize        \n"));
    Output::Print(_u("--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"));
    for (int i = 0; i < trackerDictionary->Count(); i++)
    {
        TrackerItem * item = trackerDictionary->GetValueAt(i);
        type_info const * typeinfo = trackerDictionary->GetKeyAt(i);
        if (item->instanceData.AllocCount != 0)
        {
            Output::Print(_u("%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S\n"),
                item->instanceData.ItemSize, item->instanceData.ItemCount, item->instanceData.AllocCount, item->instanceData.ReqSize,
                item->instanceData.AllocSize, item->instanceData.FreeCount, item->instanceData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount,  item->instanceData.AllocSize - item->instanceData.FreeSize, typeinfo->name());
            itemCount += item->instanceData.ItemCount;
            allocCount += item->instanceData.AllocCount;
            reqSize += item->instanceData.ReqSize;
            allocSize += item->instanceData.AllocSize;
            freeCount += item->instanceData.FreeCount;
            freeSize += item->instanceData.FreeSize;
        }

        if (item->arrayData.AllocCount != 0)
        {
            Output::Print(_u("%8d  %10d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  %S[]\n"),
                item->arrayData.ItemSize, item->arrayData.ItemCount, item->arrayData.AllocCount, item->arrayData.ReqSize,
                item->arrayData.AllocSize, item->arrayData.FreeCount, item->arrayData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount, item->arrayData.AllocSize - item->arrayData.FreeSize, typeinfo->name());
            itemCount += item->arrayData.ItemCount;
            allocCount += item->arrayData.AllocCount;
            reqSize += item->arrayData.ReqSize;
            allocSize += item->arrayData.AllocSize;
            freeCount += item->arrayData.FreeCount;
            freeSize += item->arrayData.FreeSize;
        }
    }
    Output::Print(_u("--------  ----------  ----------  ---------------  ---------------  ----------  ---------------  ----------  ---------------\n"));
    Output::Print(_u("            %8d  %10d  %15I64d  %15I64d  %10d  %15I64d  %10d  %15I64d  **Total**\n"),
        itemCount, allocCount, reqSize, allocSize, freeCount, freeSize, allocCount - freeCount, allocSize - freeSize);

#ifdef EXCEL_FRIENDLY_DUMP
    Output::Print(_u("\nExcel friendly version\nItemSize\tItemCount\tAllocCount\tRequestSize\tAllocSize\tFreeCount\tFreeSize\tDiffCount\tDiffSize\tType\n"));
    for (int i = 0; i < trackerDictionary->Count(); i++)
    {
        TrackerItem * item = trackerDictionary->GetValueAt(i);
        type_info const * typeinfo = trackerDictionary->GetKeyAt(i);
        if (item->instanceData.AllocCount != 0)
        {
            Output::Print(_u("%d\t%d\t%d\t%I64d\t%I64d\t%d\t%I64d\t%d\t%I64d\t%S\n"),
                item->instanceData.ItemSize, item->instanceData.ItemCount, item->instanceData.AllocCount, item->instanceData.ReqSize,
                item->instanceData.AllocSize, item->instanceData.FreeCount, item->instanceData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount,  item->instanceData.AllocSize - item->instanceData.FreeSize, typeinfo->name());
        }
        if (item->arrayData.AllocCount != 0)
        {
            Output::Print(_u("%d\t%d\t%d\t%I64d\t%I64d\t%d\t%I64d\t%d\t%I64d\t%S[]\n"),
                item->arrayData.ItemSize, item->arrayData.ItemCount, item->arrayData.AllocCount, item->arrayData.ReqSize,
                item->arrayData.AllocSize, item->arrayData.FreeCount, item->arrayData.FreeSize,
                item->instanceData.AllocCount - item->instanceData.FreeCount, item->arrayData.AllocSize - item->arrayData.FreeSize, typeinfo->name());
        }
    }
#endif // EXCEL_FRIENDLY_DUMP
    Output::Flush();
}